

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioButton.cpp
# Opt level: O0

shared_ptr<gui::RadioButton>
gui::RadioButton::create(shared_ptr<gui::RadioButtonStyle> *style,String *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<gui::RadioButton> sVar1;
  element_type *this;
  String *in_stack_ffffffffffffffd0;
  shared_ptr<gui::RadioButtonStyle> *in_stack_ffffffffffffffd8;
  RadioButton *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  operator_new(0x2e8);
  std::shared_ptr<gui::RadioButtonStyle>::shared_ptr
            ((shared_ptr<gui::RadioButtonStyle> *)this,(shared_ptr<gui::RadioButtonStyle> *)in_RDI);
  RadioButton(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::shared_ptr<gui::RadioButton>::shared_ptr<gui::RadioButton,void>
            ((shared_ptr<gui::RadioButton> *)this,in_RDI);
  std::shared_ptr<gui::RadioButtonStyle>::~shared_ptr((shared_ptr<gui::RadioButtonStyle> *)0x289fe6)
  ;
  sVar1.super___shared_ptr<gui::RadioButton,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::RadioButton,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::RadioButton>)
         sVar1.super___shared_ptr<gui::RadioButton,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<RadioButton> RadioButton::create(std::shared_ptr<RadioButtonStyle> style, const sf::String& name) {
    return std::shared_ptr<RadioButton>(new RadioButton(style, name));
}